

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeUpper(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int i,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *newUpper,bool scale)

{
  byte in_CL;
  cpp_dec_float<200U,_int,_void> *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffde8;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdf0;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  type_conflict5 local_1ed;
  undefined1 local_1ec [128];
  undefined1 local_16c [128];
  undefined1 local_ec [131];
  byte local_69;
  cpp_dec_float<200U,_int,_void> *local_68;
  undefined4 local_5c;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  cpp_dec_float<200U,_int,_void> *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined8 local_8;
  
  local_69 = in_CL & 1;
  local_1ed = false;
  local_68 = in_RDX;
  local_5c = in_ESI;
  if (local_69 != 0) {
    local_48 = infinity();
    local_40 = local_ec;
    local_50 = 0;
    local_8 = local_48;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_RDX,(double)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               in_stack_fffffffffffffdf0);
    local_1ed = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffffde8,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x68904b);
  }
  if (local_1ed == false) {
    local_10 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::upper_w(in_stack_fffffffffffffdf0,(int)((ulong)local_68 >> 0x20));
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffdf0,local_68);
  }
  else {
    this_00 = *(LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                **)(in_RDI + 0x218);
    local_30 = local_1ec;
    local_38 = local_68;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)this_00,in_stack_fffffffffffffde8);
    (**(code **)(*(long *)((array_type *)
                          &this_00->
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )->_M_elems + 0x160))(local_16c,this_00,in_RDI,local_5c,local_1ec);
    local_20 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::upper_w(this_00,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
    local_28 = local_16c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)this_00,in_stack_fffffffffffffde8);
  }
  return;
}

Assistant:

virtual void changeUpper(int i, const R& newUpper, bool scale = false)
   {
      if(scale && newUpper < R(infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::upper_w(i) = lp_scaler->scaleUpper(*this, i, newUpper);
      }
      else
         LPColSetBase<R>::upper_w(i) = newUpper;

      assert(isConsistent());
   }